

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  FilePath *in_RDI;
  FilePath local_50;
  undefined1 local_30 [8];
  FilePath result;
  
  FilePath::FilePath((FilePath *)local_30);
  FilePath::FilePath(&local_50,(string *)g_executable_path_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)local_30);
  std::__cxx11::string::~string((string *)&local_50);
  FilePath::RemoveDirectoryName(in_RDI,(FilePath *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}